

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleGroupBox::relations(QAccessibleGroupBox *this,Relation match)

{
  bool bVar1;
  Int IVar2;
  const_iterator o;
  QWidget **ppQVar3;
  long lVar4;
  QGroupBox *in_RDI;
  long in_FS_OFFSET;
  QWidget *kid;
  QList<QWidget_*> *__range2;
  QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *rels;
  QAccessibleInterface *iface;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QWidget_*> kids;
  Relation in_stack_0000009c;
  undefined4 in_stack_ffffffffffffff38;
  RelationFlag in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  QGroupBox *this_00;
  byte local_99;
  QWidget *in_stack_ffffffffffffff70;
  const_iterator local_50;
  undefined1 *local_48;
  QAccessibleWidget *in_stack_ffffffffffffffc0;
  QFlagsStorageHelper<QAccessible::RelationFlag,_4> local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->super_QWidget = &DAT_aaaaaaaaaaaaaaaa;
  *(pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> **)
   &(in_RDI->super_QWidget).field_0x8 =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QWidget).super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QAccessibleWidget::relations(in_stack_ffffffffffffffc0,in_stack_0000009c);
  local_14.super_QFlagsStorage<QAccessible::RelationFlag>.i =
       (QFlagsStorage<QAccessible::RelationFlag>)
       QFlags<QAccessible::RelationFlag>::operator&
                 ((QFlags<QAccessible::RelationFlag> *)
                  CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  local_99 = 0;
  if (IVar2 != 0) {
    groupBox((QAccessibleGroupBox *)0x7efc75);
    QGroupBox::title(this_00);
    bVar1 = QString::isEmpty((QString *)0x7efc97);
    local_99 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x7efcbb);
  }
  if ((local_99 & 1) != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessibleWidget::widget((QAccessibleWidget *)0x7efcff);
    _q_ac_childWidgets(in_stack_ffffffffffffff70);
    local_50.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QList<QWidget_*>::begin
                         ((QList<QWidget_*> *)CONCAT17(local_99,in_stack_ffffffffffffff40));
    o = QList<QWidget_*>::end((QList<QWidget_*> *)CONCAT17(local_99,in_stack_ffffffffffffff40));
    while (bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_50,o), bVar1) {
      ppQVar3 = QList<QWidget_*>::const_iterator::operator*(&local_50);
      lVar4 = QAccessible::queryAccessibleInterface(&(*ppQVar3)->super_QObject);
      if (lVar4 != 0) {
        QFlags<QAccessible::RelationFlag>::QFlags
                  ((QFlags<QAccessible::RelationFlag> *)CONCAT17(local_99,in_stack_ffffffffffffff40)
                   ,in_stack_ffffffffffffff3c);
        QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
        emplace_back<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>>
                  ((QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)
                   CONCAT17(local_99,in_stack_ffffffffffffff40),
                   (QAccessibleInterface **)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (QFlags<QAccessible::RelationFlag> *)0x7efdcc);
      }
      QList<QWidget_*>::const_iterator::operator++(&local_50);
    }
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7efde7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleGroupBox::relations(QAccessible::Relation match /* = QAccessible::AllRelations */) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels =
            QAccessibleWidget::relations(match);

    if ((match & QAccessible::Labelled) && (!groupBox()->title().isEmpty())) {
        const QList<QWidget*> kids = _q_ac_childWidgets(widget());
        for (QWidget *kid : kids) {
            QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(kid);
            if (iface)
                rels.emplace_back(iface, QAccessible::Relation(QAccessible::Labelled));
        }
    }
    return rels;
}